

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Window.cpp
# Opt level: O0

bool __thiscall sf::Window::setActive(Window *this,bool active)

{
  bool bVar1;
  ostream *poVar2;
  long in_RDI;
  bool unaff_retaddr;
  GlContext *in_stack_00000008;
  bool local_1;
  
  if (*(long *)(in_RDI + 0x18) == 0) {
    local_1 = false;
  }
  else {
    bVar1 = priv::GlContext::setActive(in_stack_00000008,unaff_retaddr);
    if (bVar1) {
      local_1 = true;
    }
    else {
      poVar2 = err();
      poVar2 = std::operator<<(poVar2,"Failed to activate the window\'s context");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool Window::setActive(bool active) const
{
    if (m_context)
    {
        if (m_context->setActive(active))
        {
            return true;
        }
        else
        {
            err() << "Failed to activate the window's context" << std::endl;
            return false;
        }
    }
    else
    {
        return false;
    }
}